

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

JavascriptPromiseReaction *
Js::JavascriptPromiseReaction::New
          (JavascriptPromiseCapability *capabilities,RecyclableObject *handler,
          ScriptContext *scriptContext)

{
  Recycler *pRVar1;
  JavascriptPromiseReaction *this;
  TrackAllocData local_48;
  ScriptContext *local_20;
  ScriptContext *scriptContext_local;
  RecyclableObject *handler_local;
  JavascriptPromiseCapability *capabilities_local;
  
  local_20 = scriptContext;
  scriptContext_local = (ScriptContext *)handler;
  handler_local = (RecyclableObject *)capabilities;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
             ,0x847);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this = (JavascriptPromiseReaction *)new<Memory::Recycler>(0x18,pRVar1,0x43c4b0);
  JavascriptPromiseReaction
            (this,(JavascriptPromiseCapability *)handler_local,
             (RecyclableObject *)scriptContext_local);
  return this;
}

Assistant:

JavascriptPromiseReaction* JavascriptPromiseReaction::New(JavascriptPromiseCapability* capabilities, RecyclableObject* handler, ScriptContext* scriptContext)
    {
        return RecyclerNew(scriptContext->GetRecycler(), JavascriptPromiseReaction, capabilities, handler);
    }